

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
::reject(AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
         *this,Exception *exception)

{
  ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client> local_1d0;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1d0,exception);
    local_1d0.value.ptr.isSet = false;
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::operator=
              (&this->result,&local_1d0);
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::~ExceptionOr(&local_1d0);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }